

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expert_encode.cc
# Opt level: O2

Status * __thiscall
draco::ExpertEncoder::EncodeMeshToBuffer
          (Status *__return_storage_ptr__,ExpertEncoder *this,Mesh *m,EncoderBuffer *out_buffer)

{
  EncoderOptionsBase<int> *this_00;
  int iVar1;
  MeshEdgebreakerEncoder *this_01;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"encoding_method",&local_51);
  this_00 = &(this->super_EncoderBase<draco::EncoderOptionsBase<int>_>).options_;
  iVar1 = Options::GetInt((Options *)this_00,&local_50,-1);
  std::__cxx11::string::~string((string *)&local_50);
  if (iVar1 == 1) {
LAB_001223d9:
    this_01 = (MeshEdgebreakerEncoder *)operator_new(0x88);
    MeshEdgebreakerEncoder::MeshEdgebreakerEncoder(this_01);
  }
  else {
    if (iVar1 == -1) {
      iVar1 = EncoderOptionsBase<int>::GetSpeed(this_00);
      if (iVar1 != 10) goto LAB_001223d9;
    }
    this_01 = (MeshEdgebreakerEncoder *)operator_new(0x80);
    MeshSequentialEncoder::MeshSequentialEncoder((MeshSequentialEncoder *)this_01);
  }
  MeshEncoder::SetMesh(&this_01->super_MeshEncoder,m);
  PointCloudEncoder::Encode(__return_storage_ptr__,(PointCloudEncoder *)this_01,this_00,out_buffer);
  if (__return_storage_ptr__->code_ == OK) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_msg_);
    (this->super_EncoderBase<draco::EncoderOptionsBase<int>_>).num_encoded_points_ =
         (this_01->super_MeshEncoder).super_PointCloudEncoder.num_encoded_points_;
    (this->super_EncoderBase<draco::EncoderOptionsBase<int>_>).num_encoded_faces_ =
         (this_01->super_MeshEncoder).num_encoded_faces_;
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  (*(this_01->super_MeshEncoder).super_PointCloudEncoder._vptr_PointCloudEncoder[1])(this_01);
  return __return_storage_ptr__;
}

Assistant:

Status ExpertEncoder::EncodeMeshToBuffer(const Mesh &m,
                                         EncoderBuffer *out_buffer) {
#ifdef DRACO_TRANSCODER_SUPPORTED
  // Apply DracoCompressionOptions associated with the mesh.
  DRACO_RETURN_IF_ERROR(ApplyCompressionOptions(m));
#endif  // DRACO_TRANSCODER_SUPPORTED

  std::unique_ptr<MeshEncoder> encoder;
  // Select the encoding method only based on the provided options.
  int encoding_method = options().GetGlobalInt("encoding_method", -1);
  if (encoding_method == -1) {
    // For now select the edgebreaker for all options expect of speed 10
    if (options().GetSpeed() == 10) {
      encoding_method = MESH_SEQUENTIAL_ENCODING;
    } else {
      encoding_method = MESH_EDGEBREAKER_ENCODING;
    }
  }
  if (encoding_method == MESH_EDGEBREAKER_ENCODING) {
    encoder = std::unique_ptr<MeshEncoder>(new MeshEdgebreakerEncoder());
  } else {
    encoder = std::unique_ptr<MeshEncoder>(new MeshSequentialEncoder());
  }
  encoder->SetMesh(m);

  DRACO_RETURN_IF_ERROR(encoder->Encode(options(), out_buffer));

  set_num_encoded_points(encoder->num_encoded_points());
  set_num_encoded_faces(encoder->num_encoded_faces());
  return OkStatus();
}